

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsInter.c
# Opt level: O2

sat_solver * Abc_MfsCreateSolverResub(Mfs_Man_t *p,int *pCands,int nCands,int fInvert)

{
  int **ppiVar1;
  uint __line;
  int iVar2;
  undefined8 in_RAX;
  void *pvVar3;
  Aig_Man_t *pAVar4;
  sat_solver *s;
  Cnf_Dat_t *pCVar5;
  long lVar6;
  char *__assertion;
  int iVar7;
  ulong uVar8;
  int iVar9;
  bool bVar10;
  int Lits [2];
  
  Lits[1] = (int)((ulong)in_RAX >> 0x20);
  pvVar3 = Vec_PtrEntry(p->pAigWin->vCos,~p->vDivs->nSize + p->pAigWin->nObjs[3]);
  Lits[0] = (uint)(fInvert != 0) + p->pCnf->pVarNums[*(int *)((long)pvVar3 + 0x24)] * 2;
  p->vProjVarsCnf->nSize = 0;
  pAVar4 = p->pAigWin;
  for (iVar9 = pAVar4->nObjs[3] - p->vDivs->nSize; iVar9 < pAVar4->vCos->nSize; iVar9 = iVar9 + 1) {
    pvVar3 = Vec_PtrEntry(pAVar4->vCos,iVar9);
    iVar2 = p->pCnf->pVarNums[*(int *)((long)pvVar3 + 0x24)];
    if (iVar2 < 0) {
      __assertion = "p->pCnf->pVarNums[pObjPo->Id] >= 0";
      __line = 0x66;
      goto LAB_003b23a5;
    }
    Vec_IntPush(p->vProjVarsCnf,iVar2);
    pAVar4 = p->pAigWin;
  }
  if (p->vProjVarsCnf->nSize != p->vDivs->nSize) {
    __assertion = "Vec_IntSize(p->vProjVarsCnf) == Vec_PtrSize(p->vDivs)";
    __line = 0x69;
LAB_003b23a5:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/mfs/mfsInter.c"
                  ,__line,"sat_solver *Abc_MfsCreateSolverResub(Mfs_Man_t *, int *, int, int)");
  }
  s = sat_solver_new();
  sat_solver_setnvars(s,p->pCnf->nVars * 2 + p->vDivs->nSize);
  if (pCands != (int *)0x0) {
    sat_solver_store_alloc(s);
  }
  lVar6 = 0;
  while (lVar6 < p->pCnf->nClauses) {
    ppiVar1 = p->pCnf->pClauses;
    iVar9 = sat_solver_addclause(s,ppiVar1[lVar6],ppiVar1[lVar6 + 1]);
    lVar6 = lVar6 + 1;
    if (iVar9 == 0) goto LAB_003b2371;
  }
  iVar9 = sat_solver_addclause(s,Lits,Lits + 1);
  if (iVar9 == 0) goto LAB_003b2371;
  if (p->pPars->fOneHotness != 0) {
    p->pSat = s;
    iVar9 = Abc_NtkAddOneHotness(p);
    if (iVar9 == 0) {
      return (sat_solver *)0x0;
    }
    p->pSat = (sat_solver *)0x0;
  }
  if (pCands != (int *)0x0) {
    sat_solver_store_mark_clauses_a(s);
  }
  pCVar5 = p->pCnf;
  for (lVar6 = 0; lVar6 < pCVar5->nLiterals; lVar6 = lVar6 + 1) {
    (*pCVar5->pClauses)[lVar6] = (*pCVar5->pClauses)[lVar6] + pCVar5->nVars * 2;
  }
  lVar6 = 0;
  while (pCVar5 = p->pCnf, lVar6 < pCVar5->nClauses) {
    iVar9 = sat_solver_addclause(s,pCVar5->pClauses[lVar6],pCVar5->pClauses[lVar6 + 1]);
    lVar6 = lVar6 + 1;
    if (iVar9 == 0) goto LAB_003b2371;
  }
  if (p->pPars->fOneHotness != 0) {
    p->pSat = s;
    iVar9 = Abc_NtkAddOneHotness(p);
    if (iVar9 == 0) {
      return (sat_solver *)0x0;
    }
    p->pSat = (sat_solver *)0x0;
    pCVar5 = p->pCnf;
  }
  lVar6 = 0;
  while( true ) {
    if (pCVar5->nLiterals <= lVar6) break;
    (*pCVar5->pClauses)[lVar6] = (*pCVar5->pClauses)[lVar6] + pCVar5->nVars * -2;
    lVar6 = lVar6 + 1;
  }
  Lits[0] = (Lits[0] ^ 1U) + pCVar5->nVars * 2;
  iVar9 = sat_solver_addclause(s,Lits,Lits + 1);
  if (iVar9 != 0) {
    if (pCands == (int *)0x0) {
      p->vProjVarsSat->nSize = 0;
      iVar9 = 0;
      while( true ) {
        iVar2 = p->vProjVarsCnf->nSize;
        if (iVar2 <= iVar9) break;
        iVar7 = Vec_IntEntry(p->vProjVarsCnf,iVar9);
        iVar2 = p->pCnf->nVars;
        iVar2 = Abc_MfsSatAddXor(s,iVar7,iVar2 + iVar7,iVar9 + iVar2 * 2);
        if (iVar2 == 0) goto LAB_003b2371;
        Vec_IntPush(p->vProjVarsSat,iVar9 + p->pCnf->nVars * 2);
        iVar9 = iVar9 + 1;
      }
      if (iVar2 != p->vProjVarsSat->nSize) {
        __assert_fail("Vec_IntSize(p->vProjVarsCnf) == Vec_IntSize(p->vProjVarsSat)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/mfs/mfsInter.c"
                      ,0xd3,"sat_solver *Abc_MfsCreateSolverResub(Mfs_Man_t *, int *, int, int)");
      }
      iVar9 = sat_solver_simplify(s);
      if (iVar9 != 0) {
        return s;
      }
    }
    else {
      uVar8 = 0;
      if (0 < nCands) {
        uVar8 = (ulong)(uint)nCands;
      }
      do {
        bVar10 = uVar8 == 0;
        uVar8 = uVar8 - 1;
        if (bVar10) {
          sat_solver_store_mark_roots(s);
          return s;
        }
        iVar7 = (*pCands >> 1) + p->pCnf->nVars * -2;
        iVar2 = Vec_IntEntry(p->vProjVarsCnf,iVar7);
        iVar9 = p->pCnf->nVars;
        iVar9 = Abc_MfsSatAddXor(s,iVar2,iVar9 + iVar2,iVar7 + iVar9 * 2);
        if (iVar9 == 0) break;
        iVar9 = sat_solver_addclause(s,pCands,pCands + 1);
        pCands = pCands + 1;
      } while (iVar9 != 0);
    }
  }
LAB_003b2371:
  sat_solver_delete(s);
  return (sat_solver *)0x0;
}

Assistant:

sat_solver * Abc_MfsCreateSolverResub( Mfs_Man_t * p, int * pCands, int nCands, int fInvert )
{
    sat_solver * pSat;
    Aig_Obj_t * pObjPo;
    int Lits[2], status, iVar, i, c;

    // get the literal for the output of F
    pObjPo = Aig_ManCo( p->pAigWin, Aig_ManCoNum(p->pAigWin) - Vec_PtrSize(p->vDivs) - 1 );
    Lits[0] = toLitCond( p->pCnf->pVarNums[pObjPo->Id], fInvert );

    // collect the outputs of the divisors
    Vec_IntClear( p->vProjVarsCnf );
    Vec_PtrForEachEntryStart( Aig_Obj_t *, p->pAigWin->vCos, pObjPo, i, Aig_ManCoNum(p->pAigWin) - Vec_PtrSize(p->vDivs) )
    {
        assert( p->pCnf->pVarNums[pObjPo->Id] >= 0 );
        Vec_IntPush( p->vProjVarsCnf, p->pCnf->pVarNums[pObjPo->Id] );
    }
    assert( Vec_IntSize(p->vProjVarsCnf) == Vec_PtrSize(p->vDivs) );

    // start the solver
    pSat = sat_solver_new();
    sat_solver_setnvars( pSat, 2 * p->pCnf->nVars + Vec_PtrSize(p->vDivs) );
    if ( pCands )
        sat_solver_store_alloc( pSat );

    // load the first copy of the clauses
    for ( i = 0; i < p->pCnf->nClauses; i++ )
    {
        if ( !sat_solver_addclause( pSat, p->pCnf->pClauses[i], p->pCnf->pClauses[i+1] ) )
        {
            sat_solver_delete( pSat );
            return NULL;
        }
    }
    // add the clause for the first output of F
    if ( !sat_solver_addclause( pSat, Lits, Lits+1 ) )
    {
        sat_solver_delete( pSat );
        return NULL;
    }

    // add one-hotness constraints
    if ( p->pPars->fOneHotness )
    {
        p->pSat = pSat;
        if ( !Abc_NtkAddOneHotness( p ) )
            return NULL;
        p->pSat = NULL;
    }

    // bookmark the clauses of A
    if ( pCands )
        sat_solver_store_mark_clauses_a( pSat );

    // transform the literals
    for ( i = 0; i < p->pCnf->nLiterals; i++ )
        p->pCnf->pClauses[0][i] += 2 * p->pCnf->nVars;
    // load the second copy of the clauses
    for ( i = 0; i < p->pCnf->nClauses; i++ )
    {
        if ( !sat_solver_addclause( pSat, p->pCnf->pClauses[i], p->pCnf->pClauses[i+1] ) )
        {
            sat_solver_delete( pSat );
            return NULL;
        }
    }
    // add one-hotness constraints
    if ( p->pPars->fOneHotness )
    {
        p->pSat = pSat;
        if ( !Abc_NtkAddOneHotness( p ) )
            return NULL;
        p->pSat = NULL;
    }
    // transform the literals
    for ( i = 0; i < p->pCnf->nLiterals; i++ )
        p->pCnf->pClauses[0][i] -= 2 * p->pCnf->nVars;
    // add the clause for the second output of F
    Lits[0] = 2 * p->pCnf->nVars + lit_neg( Lits[0] );
    if ( !sat_solver_addclause( pSat, Lits, Lits+1 ) )
    {
        sat_solver_delete( pSat );
        return NULL;
    }

    if ( pCands )
    {
        // add relevant clauses for EXOR gates
        for ( c = 0; c < nCands; c++ )
        {
            // get the variable number of this divisor
            i = lit_var( pCands[c] ) - 2 * p->pCnf->nVars;
            // get the corresponding SAT variable
            iVar = Vec_IntEntry( p->vProjVarsCnf, i );
            // add the corresponding EXOR gate
            if ( !Abc_MfsSatAddXor( pSat, iVar, iVar + p->pCnf->nVars, 2 * p->pCnf->nVars + i ) )
            {
                sat_solver_delete( pSat );
                return NULL;
            }
            // add the corresponding clause
            if ( !sat_solver_addclause( pSat, pCands + c, pCands + c + 1 ) )
            {
                sat_solver_delete( pSat );
                return NULL;
            }
        }
        // bookmark the roots
        sat_solver_store_mark_roots( pSat );
    }
    else
    {
        // add the clauses for the EXOR gates - and remember their outputs
        Vec_IntClear( p->vProjVarsSat );
        Vec_IntForEachEntry( p->vProjVarsCnf, iVar, i )
        {
            if ( !Abc_MfsSatAddXor( pSat, iVar, iVar + p->pCnf->nVars, 2 * p->pCnf->nVars + i ) )
            {
                sat_solver_delete( pSat );
                return NULL;
            }
            Vec_IntPush( p->vProjVarsSat, 2 * p->pCnf->nVars + i );
        }
        assert( Vec_IntSize(p->vProjVarsCnf) == Vec_IntSize(p->vProjVarsSat) );
        // simplify the solver
        status = sat_solver_simplify(pSat);
        if ( status == 0 )
        {
//            printf( "Abc_MfsCreateSolverResub(): SAT solver construction has failed. Skipping node.\n" );
            sat_solver_delete( pSat );
            return NULL;
        }
    }
    return pSat;
}